

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLSLMaterialRenderer.cpp
# Opt level: O2

bool __thiscall
irr::video::COpenGLSLMaterialRenderer::setPixelShaderConstant
          (COpenGLSLMaterialRenderer *this,s32 index,s32 *ints,int count)

{
  int iVar1;
  GLenum GVar2;
  pointer pSVar3;
  int iVar4;
  bool bVar5;
  code *pcVar6;
  
  if (index < 0) {
    return false;
  }
  pSVar3 = (this->UniformInfo).m_data.
           super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar1 = pSVar3[(uint)index].location;
  if (iVar1 < 0) {
    return false;
  }
  GVar2 = pSVar3[(uint)index].type;
  bVar5 = false;
  switch(GVar2) {
  case 0x8b53:
  case 0x8b57:
    pcVar6 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x828);
    if (pcVar6 == (code *)0x0) {
      return true;
    }
    iVar4 = 2;
    break;
  case 0x8b54:
  case 0x8b58:
    pcVar6 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x830);
    if (pcVar6 == (code *)0x0) {
      return true;
    }
    iVar4 = 3;
    break;
  case 0x8b55:
  case 0x8b59:
    pcVar6 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x838);
    if (pcVar6 == (code *)0x0) {
      return true;
    }
    iVar4 = 4;
    break;
  case 0x8b5a:
  case 0x8b5b:
  case 0x8b5c:
    goto switchD_00207e21_caseD_8b5a;
  case 0x8b5d:
  case 0x8b5e:
  case 0x8b5f:
  case 0x8b60:
  case 0x8b61:
  case 0x8b62:
    pcVar6 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x820);
    if (pcVar6 != (code *)0x0) {
      (*pcVar6)(iVar1,1,ints);
      return true;
    }
    return true;
  default:
    if (GVar2 != 0x1404) {
      return false;
    }
  case 0x8b56:
    pcVar6 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x820);
    if (pcVar6 == (code *)0x0) {
      return true;
    }
    goto LAB_00207ea6;
  }
  count = count / iVar4;
LAB_00207ea6:
  bVar5 = true;
  (*pcVar6)(iVar1,count,ints);
switchD_00207e21_caseD_8b5a:
  return bVar5;
}

Assistant:

bool COpenGLSLMaterialRenderer::setPixelShaderConstant(s32 index, const s32 *ints, int count)
{
	if (index < 0 || UniformInfo[index].location < 0)
		return false;

	bool status = true;

	switch (UniformInfo[index].type) {
	case GL_INT:
	case GL_BOOL:
		Driver->extGlUniform1iv(UniformInfo[index].location, count, reinterpret_cast<const GLint *>(ints));
		break;
	case GL_INT_VEC2:
	case GL_BOOL_VEC2:
		Driver->extGlUniform2iv(UniformInfo[index].location, count / 2, reinterpret_cast<const GLint *>(ints));
		break;
	case GL_INT_VEC3:
	case GL_BOOL_VEC3:
		Driver->extGlUniform3iv(UniformInfo[index].location, count / 3, reinterpret_cast<const GLint *>(ints));
		break;
	case GL_INT_VEC4:
	case GL_BOOL_VEC4:
		Driver->extGlUniform4iv(UniformInfo[index].location, count / 4, reinterpret_cast<const GLint *>(ints));
		break;
	case GL_SAMPLER_1D:
	case GL_SAMPLER_2D:
	case GL_SAMPLER_3D:
	case GL_SAMPLER_CUBE:
	case GL_SAMPLER_1D_SHADOW:
	case GL_SAMPLER_2D_SHADOW:
		Driver->extGlUniform1iv(UniformInfo[index].location, 1, reinterpret_cast<const GLint *>(ints));
		break;
	default:
		status = false;
		break;
	}
	return status;
}